

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_compiler.cpp
# Opt level: O0

void __thiscall
Arithmetic_AddNumbers_Test::Arithmetic_AddNumbers_Test(Arithmetic_AddNumbers_Test *this)

{
  Arithmetic_AddNumbers_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Arithmetic_AddNumbers_Test_0017fe78;
  return;
}

Assistant:

TEST(Arithmetic, AddNumbers) {
	// let a = 0 while true { a = a + 1 }
	MOCK(
		BC3(BC_ADD_LN, 0, 0, 0),
	);

	INS(IR_LOAD_STACK, 0, 0);
	INS(IR_LOAD_CONST, 0, 0);
	INS(IR_ADD, 1, 2);
}